

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  ushort uVar2;
  uint uVar3;
  KeyInfo *pKVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 uVar9;
  uint uVar10;
  ulong uVar11;
  u64 v;
  uint uVar12;
  Mem *pMem2;
  ulong local_c0;
  uint local_b4;
  UnpackedRecord *local_b0;
  u8 *local_a8;
  ulong local_a0;
  uint local_94;
  void *local_90;
  double local_88;
  long local_78;
  uint local_6c;
  Mem mem1;
  
  pMem2 = pPKey2->aMem;
  if (bSkip == 0) {
    if (*pKey1 < '\0') {
      bVar5 = sqlite3GetVarint32((uchar *)pKey1,&local_6c);
      uVar12 = (uint)bVar5;
    }
    else {
      uVar12 = 1;
      local_6c = (int)*pKey1;
    }
    local_c0 = 0;
    uVar10 = local_6c;
    goto LAB_00145c7b;
  }
  if (*(char *)((long)pKey1 + 1) < '\0') {
    bVar5 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&mem1);
    uVar12 = bVar5 + 1;
    local_6c = (uint)*pKey1;
    uVar9 = mem1.u.nZero;
    if ((uint)mem1.u.nZero < 0x80) goto LAB_00145c65;
    uVar10 = mem1.u.nZero - 0xcU >> 1;
  }
  else {
    local_6c = (uint)*pKey1;
    uVar12 = 2;
    uVar9 = (int)*(char *)((long)pKey1 + 1);
LAB_00145c65:
    uVar10 = (uint)""[(uint)uVar9];
  }
  pMem2 = pMem2 + 1;
  local_c0 = 1;
  uVar10 = uVar10 + local_6c;
LAB_00145c7b:
  if ((uint)nKey1 < uVar10) {
    iVar6 = sqlite3CorruptError(0x13ac7);
    pPKey2->errCode = (u8)iVar6;
LAB_00145c8e:
    iVar6 = 0;
  }
  else {
    local_a8 = &pPKey2->errCode;
    local_94 = local_6c;
    local_90 = pKey1;
    do {
      uVar8 = (ulong)uVar10;
      uVar2 = pMem2->flags;
      uVar11 = (ulong)uVar12;
      local_a0 = uVar8;
      if ((uVar2 & 4) == 0) {
        if ((uVar2 & 8) != 0) {
          bVar5 = *(byte *)((long)pKey1 + uVar11);
          v = (u64)bVar5;
          if (9 < bVar5) goto LAB_001460af;
          if (bVar5 == 0) goto LAB_001460bc;
          sqlite3VdbeSerialGet((uchar *)(uVar8 + (long)pKey1),(uint)bVar5,&mem1);
          dVar1 = (pMem2->u).r;
          if (bVar5 == 7) {
            if (dVar1 <= (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero)) {
              v = 7;
              if (dVar1 < (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero)) goto LAB_001460b7;
              goto LAB_00146043;
            }
          }
          else if (dVar1 <= (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero)) {
            uVar10 = (uint)(dVar1 < (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero));
            local_88 = dVar1;
            goto LAB_0014603b;
          }
          goto LAB_001460b3;
        }
        if ((uVar2 & 2) == 0) {
          bVar5 = *(byte *)((long)pKey1 + uVar11);
          v = (u64)bVar5;
          if ((uVar2 & 0x10) == 0) {
            uVar10 = (uint)(bVar5 != 0);
          }
          else {
            if ((char)bVar5 < '\0') {
              sqlite3GetVarint32((uchar *)(uVar11 + (long)pKey1),&local_b4);
              v = (u64)local_b4;
            }
            if ((uint)v < 0xc) goto LAB_001460bc;
            if ((v & 1) != 0) goto LAB_001460b3;
            uVar10 = (uint)v - 0xc >> 1;
            local_b0 = pPKey2;
            if ((uint)nKey1 < (int)local_a0 + uVar10) {
              iVar6 = 0x13b30;
              goto LAB_001460f6;
            }
            if ((pMem2->flags & 0x4000) == 0) {
              uVar3 = pMem2->n;
              uVar7 = uVar3;
              if ((int)uVar10 < (int)uVar3) {
                uVar7 = uVar10;
              }
              uVar7 = memcmp((void *)(uVar8 + (long)pKey1),pMem2->z,(long)(int)uVar7);
              pPKey2 = local_b0;
              if (uVar7 != 0) goto LAB_001460c4;
            }
            else {
              iVar6 = isAllZero((char *)(uVar8 + (long)pKey1),uVar10);
              if (iVar6 == 0) {
                uVar7 = 1;
                pPKey2 = local_b0;
                goto LAB_001460c4;
              }
              uVar3 = (pMem2->u).nZero;
            }
            pPKey2 = local_b0;
            uVar10 = uVar10 - uVar3;
          }
LAB_0014603b:
          uVar7 = uVar10;
          if (uVar7 != 0) goto LAB_001460c4;
          goto LAB_00146043;
        }
        uVar10 = (int)*(char *)((long)pKey1 + uVar11);
        if (*(char *)((long)pKey1 + uVar11) < 0) {
          sqlite3GetVarint32((uchar *)(uVar11 + (long)pKey1),&local_b4);
          uVar10 = local_b4;
        }
        v = (u64)uVar10;
        if (uVar10 < 0xc) {
LAB_001460bc:
          uVar7 = 0xffffffff;
          goto LAB_001460c4;
        }
        if ((uVar10 & 1) == 0) goto LAB_001460b7;
        mem1.n = uVar10 - 0xc >> 1;
        if (((uint)((int)local_a0 + mem1.n) <= (uint)nKey1) &&
           (pKVar4 = pPKey2->pKeyInfo, local_c0 < pKVar4->nAllField)) {
          if (pKVar4->aColl[local_c0] == (CollSeq *)0x0) {
            uVar3 = pMem2->n;
            uVar10 = mem1.n - uVar3;
            if (mem1.n < (int)uVar3) {
              uVar3 = mem1.n;
            }
            uVar7 = memcmp((void *)(uVar8 + (long)pKey1),pMem2->z,(long)(int)uVar3);
            if (uVar7 != 0) goto LAB_001460c4;
          }
          else {
            mem1.enc = pKVar4->enc;
            mem1.db = pKVar4->db;
            mem1.flags = 2;
            mem1.z = (char *)(uVar8 + (long)pKey1);
            uVar10 = vdbeCompareMemString(&mem1,pMem2,pKVar4->aColl[local_c0],local_a8);
          }
          goto LAB_0014603b;
        }
        iVar6 = 0x13b12;
LAB_001460f6:
        iVar6 = sqlite3CorruptError(iVar6);
        *local_a8 = (u8)iVar6;
        goto LAB_00145c8e;
      }
      bVar5 = *(byte *)((long)pKey1 + uVar11);
      v = (u64)bVar5;
      if (9 < bVar5) {
LAB_001460af:
        uVar7 = 1;
        goto LAB_001460c4;
      }
      if (bVar5 == 7) {
        serialGet((uchar *)(uVar8 + (long)pKey1),7,&mem1);
        local_78 = (pMem2->u).i;
        if ((double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero) <= (double)local_78) {
          v = 7;
          uVar10 = -(uint)((double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero) < (double)local_78);
          goto LAB_0014603b;
        }
        goto LAB_001460af;
      }
      if (bVar5 == 0) goto LAB_001460b3;
      switch(bVar5) {
      case 1:
        uVar8 = (ulong)*(char *)((long)pKey1 + uVar8);
        goto LAB_00145ff7;
      case 2:
        uVar11 = (long)*(char *)((long)pKey1 + uVar8) << 8;
        uVar8 = (ulong)*(byte *)((long)pKey1 + uVar8 + 1);
        break;
      case 3:
        uVar11 = (ulong)*(byte *)((long)pKey1 + uVar8 + 1) << 8 |
                 (long)*(char *)((long)pKey1 + uVar8) << 0x10;
        uVar8 = (ulong)*(byte *)((long)pKey1 + uVar8 + 2);
        break;
      case 4:
        uVar11 = (ulong)*(byte *)((long)pKey1 + uVar8 + 2) << 8 |
                 (long)(int)((uint)*(byte *)((long)pKey1 + uVar8) << 0x18) |
                 (ulong)*(byte *)((long)pKey1 + uVar8 + 1) << 0x10;
        uVar8 = (ulong)*(byte *)((long)pKey1 + uVar8 + 3);
        break;
      case 5:
        uVar10 = *(uint *)((long)pKey1 + uVar8 + 2);
        uVar11 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                        uVar10 << 0x18);
        uVar8 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar8),
                                           *(undefined1 *)((long)pKey1 + uVar8 + 1)) << 0x20;
        break;
      case 6:
        uVar8 = *(ulong *)((long)pKey1 + uVar8);
        uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        goto LAB_00145ff7;
      default:
        uVar8 = (ulong)(bVar5 - 8);
        goto LAB_00145ff7;
      }
      uVar8 = uVar8 | uVar11;
LAB_00145ff7:
      if ((long)uVar8 < (pMem2->u).i) {
LAB_001460b3:
        uVar7 = 0xffffffff;
LAB_001460c4:
        if (pPKey2->pKeyInfo->aSortOrder[local_c0 & 0xffffffff] != '\0') {
          return -uVar7;
        }
        return uVar7;
      }
      if ((pMem2->u).i < (long)uVar8) {
LAB_001460b7:
        uVar7 = 1;
        goto LAB_001460c4;
      }
LAB_00146043:
      pKey1 = local_90;
      local_c0 = local_c0 + 1;
      if (local_c0 == pPKey2->nField) break;
      if ((uint)v < 0x80) {
        uVar10 = (uint)""[v];
      }
      else {
        uVar10 = (uint)v - 0xc >> 1;
      }
      iVar6 = sqlite3VarintLen(v);
      uVar12 = uVar12 + iVar6;
      if (local_94 <= uVar12) break;
      pMem2 = pMem2 + 1;
      uVar10 = uVar10 + (int)local_a0;
    } while (uVar10 <= (uint)nKey1);
    pPKey2->eqSeen = '\x01';
    iVar6 = (int)pPKey2->default_rc;
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1;
    idx1 = 1 + getVarint32(&aKey1[1], s1);
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    idx1 = getVarint32(aKey1, szHdr1);
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){ 
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField 
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortOrder!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  do{
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & MEM_Int ){
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future 
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n; 
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0);
    }

    if( rc!=0 ){
      if( pPKey2->pKeyInfo->aSortOrder[i] ){
        rc = -rc;
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    idx1 += sqlite3VarintLen(serial_type);
  }while( idx1<(unsigned)szHdr1 && d1<=(unsigned)nKey1 );

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB 
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc) 
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}